

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.cc
# Opt level: O3

ostream * lf::mesh::operator<<(ostream *stream,Entity *entity)

{
  int iVar1;
  ostream *poVar2;
  RefEl local_31;
  string local_30;
  
  iVar1 = (*entity->_vptr_Entity[4])(entity);
  local_31.type_ = (RefElType)iVar1;
  base::RefEl::ToString_abi_cxx11_(&local_30,&local_31);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,local_30._M_dataplus._M_p,local_30._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return poVar2;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, const lf::mesh::Entity& entity) {
  return stream << entity.RefEl();
}